

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

const_pointer __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
::data(InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
       *this)

{
  bool bVar1;
  undefined8 local_30;
  InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
  *this_local;
  
  bVar1 = inlined_vector_internal::
          Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
          ::GetIsAllocated(&this->storage_);
  if (bVar1) {
    local_30 = inlined_vector_internal::
               Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
               ::GetAllocatedData(&this->storage_);
  }
  else {
    local_30 = inlined_vector_internal::
               Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
               ::GetInlinedData(&this->storage_);
  }
  return local_30;
}

Assistant:

const_pointer data() const noexcept ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return storage_.GetIsAllocated() ? storage_.GetAllocatedData()
                                     : storage_.GetInlinedData();
  }